

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O0

parser_error parse_quest_place(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  int iVar3;
  char *pcVar4;
  level_conflict *plVar5;
  locality local_4c;
  char *pcStack_48;
  wchar_t i;
  char *block;
  char *lev_name;
  quest_place *q_place;
  char *pcStack_28;
  wchar_t depth;
  char *loc_name;
  quest *q;
  parser *p_local;
  
  q = (quest *)p;
  loc_name = (char *)parser_priv(p);
  pcStack_28 = parser_getsym((parser *)q,"locality");
  q_place._4_4_ = parser_getint((parser *)q,"depth");
  lev_name = *(char **)(loc_name + 0x18);
  if (loc_name == (char *)0x0) {
    __assert_fail("q",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-quest.c"
                  ,0x9c,"enum parser_error parse_quest_place(struct parser *)");
  }
  if (*(long *)(loc_name + 0x18) != 0) {
    for (; *(long *)(lev_name + 0x10) != 0; lev_name = *(char **)(lev_name + 0x10)) {
    }
    eVar2 = grab_name("locality",pcStack_28,localities,0x27,(int *)&local_4c);
    if (eVar2 == 0) {
      pcVar4 = locality_name(local_4c);
      pcVar4 = format("%s %d",pcVar4,(ulong)(uint)q_place._4_4_);
      block = string_make(pcVar4);
      if (*(long *)lev_name == 0) {
        p_local._4_4_ = PARSE_ERROR_INVALID_MAP;
      }
      else {
        plVar5 = level_by_name(*(level_map **)lev_name,block);
        *(int *)(lev_name + 8) = plVar5->index;
        string_free(block);
        _Var1 = parser_hasval((parser *)q,"block");
        if (_Var1) {
          pcStack_48 = parser_getsym((parser *)q,"block");
          iVar3 = strcmp(pcStack_48,"block");
          if (iVar3 != 0) {
            return PARSE_ERROR_INVALID_STRING;
          }
          lev_name[0xc] = '\x01';
        }
        else {
          lev_name[0xc] = '\0';
        }
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
    }
    else {
      p_local._4_4_ = PARSE_ERROR_INVALID_LOCALITY;
    }
    return p_local._4_4_;
  }
  __assert_fail("q->place",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-quest.c"
                ,0x9d,"enum parser_error parse_quest_place(struct parser *)");
}

Assistant:

static enum parser_error parse_quest_place(struct parser *p) {
	struct quest *q = parser_priv(p);
	const char *loc_name = parser_getsym(p, "locality");
	const int depth = parser_getint(p, "depth");
	struct quest_place *q_place = q->place;
	char *lev_name;
	const char *block;
	int i;
	assert(q);
	assert(q->place);

	while (q_place->next) {
		q_place = q_place->next;
	}

	if (grab_name("locality", loc_name, localities, N_ELEMENTS(localities), &i))
		return PARSE_ERROR_INVALID_LOCALITY;
	lev_name = string_make(format("%s %d", locality_name(i), depth));
	if (!q_place->map) return PARSE_ERROR_INVALID_MAP;
	q_place->place = level_by_name(q_place->map, lev_name)->index;
	string_free(lev_name);

	if (parser_hasval(p, "block")) {
		block = parser_getsym(p, "block");
		if (streq(block, "block")) {
			q_place->block = true;
		} else {
			return PARSE_ERROR_INVALID_STRING;
		}
	} else {
		q_place->block = false;
	}
	return PARSE_ERROR_NONE;
}